

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.h
# Opt level: O0

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::PrintableTemplateString_abi_cxx11_
          (TemplateDictionary *this,TemplateString *ts)

{
  char *pcVar1;
  size_t sVar2;
  allocator local_19;
  TemplateString *local_18;
  TemplateString *ts_local;
  
  local_18 = ts;
  ts_local = (TemplateString *)this;
  pcVar1 = TemplateString::data(ts);
  sVar2 = TemplateString::size(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,sVar2,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return this;
}

Assistant:

static std::string PrintableTemplateString(
      const TemplateString& ts) {
    return std::string(ts.data(), ts.size());
  }